

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O2

void __thiscall Imf_3_2::Image::renameChannel(Image *this,string *oldName,string *newName)

{
  ChannelMap *this_00;
  _Rb_tree_header *p_Var1;
  long lVar2;
  long *plVar3;
  _Rb_tree_color _Var4;
  undefined4 uVar5;
  __type _Var6;
  iterator __position;
  iterator iVar7;
  mapped_type *pmVar8;
  ostream *poVar9;
  ArgExc *pAVar10;
  long lVar11;
  int y;
  long lVar12;
  int x;
  long lVar13;
  stringstream _iex_throw_s;
  ostream local_1a8 [376];
  
  _Var6 = std::operator==(oldName,newName);
  if (!_Var6) {
    this_00 = &this->_channels;
    __position = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
                 ::find(&this_00->_M_t,oldName);
    p_Var1 = &(this->_channels)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)__position._M_node == p_Var1) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
      poVar9 = std::operator<<(local_1a8,"Cannot rename image channel ");
      poVar9 = std::operator<<(poVar9,(string *)oldName);
      poVar9 = std::operator<<(poVar9," to ");
      poVar9 = std::operator<<(poVar9,(string *)newName);
      poVar9 = std::operator<<(poVar9,".  The image does not have a channel called ");
      poVar9 = std::operator<<(poVar9,(string *)oldName);
      std::operator<<(poVar9,".");
      pAVar10 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(pAVar10,(stringstream *)&_iex_throw_s);
      __cxa_throw(pAVar10,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
    }
    iVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
            ::find(&this_00->_M_t,newName);
    if ((_Rb_tree_header *)iVar7._M_node != p_Var1) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
      poVar9 = std::operator<<(local_1a8,"Cannot rename image channel ");
      poVar9 = std::operator<<(poVar9,(string *)oldName);
      poVar9 = std::operator<<(poVar9," to ");
      poVar9 = std::operator<<(poVar9,(string *)newName);
      poVar9 = std::operator<<(poVar9,".  The image already has a channel called ");
      poVar9 = std::operator<<(poVar9,(string *)newName);
      std::operator<<(poVar9,".");
      pAVar10 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(pAVar10,(stringstream *)&_iex_throw_s);
      __cxa_throw(pAVar10,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
    }
    lVar11 = 0;
    for (lVar12 = 0; lVar12 < (this->_levels)._sizeX; lVar12 = lVar12 + 1) {
      for (lVar13 = 0; lVar2 = (this->_levels)._sizeY, lVar13 < lVar2; lVar13 = lVar13 + 1) {
        plVar3 = *(long **)((long)(this->_levels)._data + lVar13 * 8 + lVar2 * lVar11);
        if (plVar3 != (long *)0x0) {
          (**(code **)(*plVar3 + 0x38))(plVar3,oldName,newName);
        }
      }
      lVar11 = lVar11 + 8;
    }
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
             ::operator[](this_00,newName);
    _Var4 = __position._M_node[2]._M_color;
    uVar5 = *(undefined4 *)&__position._M_node[2].field_0x4;
    *(undefined8 *)((long)&pmVar8->xSampling + 1) = *(undefined8 *)&__position._M_node[2].field_0x5;
    pmVar8->type = _Var4;
    pmVar8->xSampling = uVar5;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Imf_3_2::Image::ChannelInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,Imf_3_2::Image::ChannelInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Imf_3_2::Image::ChannelInfo>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Imf_3_2::Image::ChannelInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,Imf_3_2::Image::ChannelInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Imf_3_2::Image::ChannelInfo>>>
                        *)this_00,__position);
  }
  return;
}

Assistant:

void
Image::renameChannel (const string& oldName, const string& newName)
{
    if (oldName == newName) return;

    ChannelMap::iterator oldChannel = _channels.find (oldName);

    if (oldChannel == _channels.end ())
    {
        THROW (
            ArgExc,
            "Cannot rename image channel " << oldName
                                           << " "
                                              "to "
                                           << newName
                                           << ".  The image does not have "
                                              "a channel called "
                                           << oldName << ".");
    }

    if (_channels.find (newName) != _channels.end ())
    {
        THROW (
            ArgExc,
            "Cannot rename image channel " << oldName
                                           << " "
                                              "to "
                                           << newName
                                           << ".  The image already has "
                                              "a channel called "
                                           << newName << ".");
    }

    try
    {
        for (int y = 0; y < _levels.height (); ++y)
            for (int x = 0; x < _levels.width (); ++x)
                if (_levels[y][x])
                    _levels[y][x]->renameChannel (oldName, newName);

        _channels[newName] = oldChannel->second;
        _channels.erase (oldChannel);
    }
    catch (...)
    {
        eraseChannel (oldName);
        eraseChannel (newName);
        throw;
    }
}